

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

char * ImGui::TableGetColumnName(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  int in_ESI;
  long in_RDI;
  ImGuiTableColumn *column;
  char *local_8;
  
  if (((*(byte *)(in_RDI + 0x1f9) & 1) == 0) && (*(char *)(in_RDI + 0x1e3) <= in_ESI)) {
    local_8 = "";
  }
  else {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_ESI);
    if (pIVar1->NameOffset == -1) {
      local_8 = "";
    }
    else {
      local_8 = ImVector<char>::operator[]
                          ((ImVector<char> *)(in_RDI + 0x198),(int)pIVar1->NameOffset);
    }
  }
  return local_8;
}

Assistant:

const char* ImGui::TableGetColumnName(const ImGuiTable* table, int column_n)
{
    if (table->IsLayoutLocked == false && column_n >= table->DeclColumnsCount)
        return ""; // NameOffset is invalid at this point
    const ImGuiTableColumn* column = &table->Columns[column_n];
    if (column->NameOffset == -1)
        return "";
    return &table->ColumnsNames.Buf[column->NameOffset];
}